

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CreationTest.cpp
# Opt level: O2

void __thiscall
TApp_MultipleSubcomMatchingWithCase_Test::TestBody(TApp_MultipleSubcomMatchingWithCase_Test *this)

{
  bool bVar1;
  App *this_00;
  App *this_01;
  AssertHelper local_a0;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  string local_90;
  string local_70;
  string local_50;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,"first",(allocator *)&local_98);
  std::__cxx11::string::string((string *)&local_50,"",(allocator *)&local_a0);
  this_01 = &(this->super_TApp).app;
  this_00 = CLI::App::add_subcommand(this_01,&local_30,&local_50);
  CLI::App::ignore_case(this_00,true);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_70,"fIrst",(allocator *)&local_98);
    std::__cxx11::string::string((string *)&local_90,"",(allocator *)&local_a0);
    CLI::App::add_subcommand(this_01,&local_70,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_70);
  }
  testing::Message::Message((Message *)&local_98);
  testing::internal::AssertHelper::AssertHelper
            (&local_a0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/CreationTest.cpp"
             ,0x53,
             "Expected: app.add_subcommand(\"fIrst\") throws an exception of type CLI::OptionAlreadyAdded.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_98);
  testing::internal::AssertHelper::~AssertHelper(&local_a0);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_98);
  return;
}

Assistant:

TEST_F(TApp, MultipleSubcomMatchingWithCase) {
    app.add_subcommand("first")->ignore_case();
    EXPECT_THROW(app.add_subcommand("fIrst"), CLI::OptionAlreadyAdded);
}